

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DOMAttrMapImpl::readOnly(DOMAttrMapImpl *this)

{
  DOMNodeImpl *pDVar1;
  
  pDVar1 = castToNodeImpl(this->fOwnerNode);
  return (pDVar1->flags & 1) != 0;
}

Assistant:

bool DOMAttrMapImpl::readOnly() {
    return castToNodeImpl(fOwnerNode)->isReadOnly();
}